

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::init(XMLAbstractDoubleFloat *this,EVP_PKEY_CTX *ctx)

{
  XMLCh XVar1;
  bool bVar2;
  int extraout_EAX;
  XMLCh *pXVar3;
  XMLSize_t XVar4;
  NumberFormatException *pNVar5;
  ulong uVar6;
  ArrayJanitor<char16_t> janTmpName;
  char buffer [101];
  
  if ((ctx == (EVP_PKEY_CTX *)0x0) || (*(short *)ctx == 0)) {
    pNVar5 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x45,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar5,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  pXVar3 = XMLString::replicate((XMLCh *)ctx,this->fMemoryManager);
  this->fRawData = pXVar3;
  pXVar3 = XMLString::replicate((XMLCh *)ctx,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor(&janTmpName,pXVar3,this->fMemoryManager);
  XMLString::trim(pXVar3);
  if (*pXVar3 == L'\0') {
    pNVar5 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x4e,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar5,&NumberFormatException::typeinfo,XMLException::~XMLException);
  }
  normalizeZero(this,pXVar3);
  bVar2 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgNegINFString);
  if (bVar2) {
    this->fType = NegINF;
    this->fSign = -1;
  }
  else {
    bVar2 = XMLString::equals(pXVar3,L"INF");
    if (bVar2) {
      this->fType = PosINF;
      this->fSign = 1;
    }
    else {
      bVar2 = XMLString::equals(pXVar3,L"NaN");
      if (bVar2) {
        this->fType = NaN;
        this->fSign = 1;
      }
      else {
        for (uVar6 = 0; XVar1 = pXVar3[uVar6], XVar1 != L'\0'; uVar6 = uVar6 + 1) {
          if ((9 < (ushort)(XVar1 + L'￐')) &&
             ((0x3a < (ushort)XVar1 - 0x2b ||
              ((0x40000000400000dU >> ((ulong)((ushort)XVar1 - 0x2b) & 0x3f) & 1) == 0)))) {
            pNVar5 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                       ,0x7f,XMLNUM_Inv_chars,this->fMemoryManager);
            __cxa_throw(pNVar5,&NumberFormatException::typeinfo,XMLException::~XMLException);
          }
        }
        if (uVar6 < 100) {
          XMLString::transcode(pXVar3,buffer,100,this->fMemoryManager);
          buffer[100] = '\0';
          XVar4 = XMLString::stringLen(buffer);
          if (XVar4 != uVar6) {
            pNVar5 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                       ,0x9f,XMLNUM_Inv_chars,this->fMemoryManager);
            __cxa_throw(pNVar5,&NumberFormatException::typeinfo,XMLException::~XMLException);
          }
          (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])(this,buffer);
        }
        else {
          buffer._0_8_ = XMLString::transcode(pXVar3,this->fMemoryManager);
          buffer._8_8_ = this->fMemoryManager;
          (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])(this,buffer._0_8_);
          ArrayJanitor<char>::~ArrayJanitor((ArrayJanitor<char> *)buffer);
        }
      }
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&janTmpName);
  return extraout_EAX;
}

Assistant:

void XMLAbstractDoubleFloat::init(const XMLCh* const strValue)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    fRawData = XMLString::replicate(strValue, fMemoryManager);   // preserve the raw data form

    XMLCh* tmpStrValue = XMLString::replicate(strValue, fMemoryManager);
    ArrayJanitor<XMLCh> janTmpName(tmpStrValue, fMemoryManager);
    XMLString::trim(tmpStrValue);

    if (!*tmpStrValue) 
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    normalizeZero(tmpStrValue);

    if (XMLString::equals(tmpStrValue, XMLUni::fgNegINFString) )
    {
        fType = NegINF;
        fSign = -1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgPosINFString) )
    {
        fType = PosINF;
        fSign = 1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgNaNString) )
    {
        fType = NaN;
        fSign = 1;
    }
    else
        //
        // Normal case
        //
    {
        // Use a stack-based buffer when possible.  Since all
        // valid doubles or floats will only contain ASCII
        // digits, a decimal point,  or the exponent character,
        // they will all be single byte characters, and this will
        // work.
        static const XMLSize_t maxStackSize = 100;

        XMLSize_t lenTempStrValue = 0;

        
        // Need to check that the string only contains valid schema characters
        // since the call to strtod may allow other values.  For example, AIX
        // allows "infinity" and "+INF"
        XMLCh curChar;
        while ((curChar = tmpStrValue[lenTempStrValue])!=0) {
            if (!((curChar >= chDigit_0 &&
                   curChar <= chDigit_9) ||
                  curChar == chPeriod  ||
                  curChar == chDash    ||
                  curChar == chPlus    ||
                  curChar == chLatin_E ||
                  curChar == chLatin_e)) {                
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }            
            lenTempStrValue++;
        }
       
        if (lenTempStrValue < maxStackSize)
        {
            char    buffer[maxStackSize + 1];

            XMLString::transcode(
                tmpStrValue,
                buffer,
                sizeof(buffer) - 1,
                getMemoryManager());

            // Do this for safety, because we've
            // no guarantee we didn't overrun the
            // capacity of the buffer when transcoding
            // a bogus value.
            buffer[maxStackSize] = '\0';

            // If they aren't the same length, then some
            // non-ASCII multibyte character was present.
            // This will only happen in the case where the
            // string has a bogus character, and it's long
            // enough to overrun this buffer, but we need
            // to check, even if it's unlikely to happen.
            if (XMLString::stringLen(buffer) != lenTempStrValue)
            {
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }

            checkBoundary(buffer);
        }
        else
        {
            char *nptr = XMLString::transcode(tmpStrValue, getMemoryManager());
            const ArrayJanitor<char> janStr(nptr, fMemoryManager);

            checkBoundary(nptr);
        }
    }

}